

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_ffmpeg.c
# Opt level: O0

size_t ffmpeg_get_total_frames(input_handle *ih)

{
  double dVar1;
  ulong local_20;
  double tmp;
  input_handle *ih_local;
  
  dVar1 = (((double)ih->format_context->streams[ih->audio_stream]->duration *
           (double)(ih->format_context->streams[ih->audio_stream]->time_base).num) /
          (double)(ih->format_context->streams[ih->audio_stream]->time_base).den) *
          (double)ih->codec_context->sample_rate;
  if (0.0 < dVar1) {
    dVar1 = dVar1 + 0.5;
    local_20 = (ulong)dVar1;
    local_20 = local_20 | (long)(dVar1 - 9.223372036854776e+18) & (long)local_20 >> 0x3f;
  }
  else {
    local_20 = 0;
  }
  return local_20;
}

Assistant:

static size_t
ffmpeg_get_total_frames(struct input_handle *ih)
{
	double tmp =
	    (double)ih->format_context->streams[ih->audio_stream]->duration *
	    (double)ih->format_context->streams[ih->audio_stream]
		->time_base.num /
	    (double)ih->format_context->streams[ih->audio_stream]
		->time_base.den *
	    (double)ih->codec_context->sample_rate;

	return tmp <= 0.0 ? 0 : (size_t)(tmp + 0.5);
}